

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_GenBooth(char *pFileName,int nVars)

{
  FILE *__stream;
  char *pcVar1;
  FILE *pFile;
  int nVars_local;
  char *pFileName_local;
  
  if (0 < nVars) {
    __stream = fopen(pFileName,"w");
    pcVar1 = Extra_TimeStamp();
    fprintf(__stream,"# %d-bit signed Booth multiplier generated by ABC on %s\n",(ulong)(uint)nVars,
            pcVar1);
    Abc_WriteBooth((FILE *)__stream,nVars);
    fclose(__stream);
    return;
  }
  __assert_fail("nVars > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcGen.c"
                ,0x46f,"void Abc_GenBooth(char *, int)");
}

Assistant:

void Abc_GenBooth( char * pFileName, int nVars )
{
    FILE * pFile;
    assert( nVars > 0 );
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# %d-bit signed Booth multiplier generated by ABC on %s\n", nVars, Extra_TimeStamp() );
    Abc_WriteBooth( pFile, nVars );
    fclose( pFile );
}